

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O0

Instr * Peeps::RemoveDeadBlock(Instr *instr,bool *wasStmtBoundaryKeptInDeadBlock)

{
  bool *pbVar1;
  IRKind IVar2;
  bool bVar3;
  bool bVar4;
  LabelInstr *pLVar5;
  bool local_4a;
  bool local_3b;
  byte local_3a;
  bool canMoveStatementBoundaryUnderNextLabel;
  Instr *deadInstr;
  Instr *lastStatementBoundary;
  bool *wasStmtBoundaryKeptInDeadBlock_local;
  Instr *instr_local;
  
  deadInstr = (Instr *)0x0;
  wasStmtBoundaryKeptInDeadBlock_local = (bool *)instr;
  while( true ) {
    local_3a = 0;
    if (wasStmtBoundaryKeptInDeadBlock_local != (bool *)0x0) {
      IVar2 = IR::Instr::GetKind((Instr *)wasStmtBoundaryKeptInDeadBlock_local);
      local_3b = true;
      if (IVar2 != InstrKindLabel) {
        local_3b = IR::Instr::IsProfiledLabelInstr((Instr *)wasStmtBoundaryKeptInDeadBlock_local);
      }
      local_3a = 0;
      if (local_3b == false) {
        bVar3 = IR::Instr::IsExitInstr((Instr *)wasStmtBoundaryKeptInDeadBlock_local);
        local_3a = bVar3 ^ 0xff;
      }
    }
    if ((local_3a & 1) == 0) break;
    pbVar1 = *(bool **)(wasStmtBoundaryKeptInDeadBlock_local + 0x10);
    bVar3 = IR::Instr::IsPragmaInstr((Instr *)wasStmtBoundaryKeptInDeadBlock_local);
    if ((bVar3) && (*(short *)(wasStmtBoundaryKeptInDeadBlock_local + 0x30) == 0x179)) {
      if (deadInstr != (Instr *)0x0) {
        IR::Instr::Remove(deadInstr);
      }
      deadInstr = (Instr *)wasStmtBoundaryKeptInDeadBlock_local;
      wasStmtBoundaryKeptInDeadBlock_local = pbVar1;
    }
    else {
      IR::Instr::Remove((Instr *)wasStmtBoundaryKeptInDeadBlock_local);
      wasStmtBoundaryKeptInDeadBlock_local = pbVar1;
    }
  }
  bVar3 = false;
  if (wasStmtBoundaryKeptInDeadBlock_local != (bool *)0x0) {
    IVar2 = IR::Instr::GetKind((Instr *)wasStmtBoundaryKeptInDeadBlock_local);
    local_4a = true;
    if (IVar2 != InstrKindLabel) {
      local_4a = IR::Instr::IsProfiledLabelInstr((Instr *)wasStmtBoundaryKeptInDeadBlock_local);
    }
    bVar3 = false;
    if (local_4a != false) {
      pLVar5 = IR::Instr::AsLabelInstr((Instr *)wasStmtBoundaryKeptInDeadBlock_local);
      bVar3 = ((byte)pLVar5->field_0x78 >> 1 & 1) == 0;
    }
  }
  if ((deadInstr != (Instr *)0x0) && (bVar3)) {
    IR::Instr::Unlink(deadInstr);
    IR::Instr::InsertAfter((Instr *)wasStmtBoundaryKeptInDeadBlock_local,deadInstr);
  }
  if (wasStmtBoundaryKeptInDeadBlock != (bool *)0x0) {
    bVar4 = false;
    if (deadInstr != (Instr *)0x0) {
      bVar4 = (bool)(bVar3 ^ 1);
    }
    *wasStmtBoundaryKeptInDeadBlock = bVar4;
  }
  return (Instr *)wasStmtBoundaryKeptInDeadBlock_local;
}

Assistant:

IR::Instr *Peeps::RemoveDeadBlock(IR::Instr *instr, bool* wasStmtBoundaryKeptInDeadBlock /* = nullptr */)
{
    IR::Instr* lastStatementBoundary = nullptr;

    while (instr && !instr->IsLabelInstr() && !instr->IsExitInstr())
    {
        IR::Instr *deadInstr = instr;
        instr = instr->m_next;

        if (deadInstr->IsPragmaInstr() && deadInstr->m_opcode == Js::OpCode::StatementBoundary)
        {
            if (lastStatementBoundary)
            {
                //Its enough if we keep latest statement boundary. Rest are dead anyway.
                lastStatementBoundary->Remove();
            }
            lastStatementBoundary = deadInstr;
        }
        else
        {
            deadInstr->Remove();
        }
    }

    // Do not let StatementBoundary to move across non-helper and helper blocks, very important under debugger:
    // if we let that happen, helper block can be moved to the end of the func so that statement maps will miss one statement.
    // Issues can be when (normally, StatementBoundary should never belong to a helper label):
    // - if we remove the label and prev label is a helper, StatementBoundary will be moved inside helper.
    // - if we move StatementBoundary under next label which is a helper, same problem again.
    bool canMoveStatementBoundaryUnderNextLabel = instr && instr->IsLabelInstr() && !instr->AsLabelInstr()->isOpHelper;

    if (lastStatementBoundary && canMoveStatementBoundaryUnderNextLabel)
    {
        lastStatementBoundary->Unlink();
        instr->InsertAfter(lastStatementBoundary);
    }

    if (wasStmtBoundaryKeptInDeadBlock)
    {
        *wasStmtBoundaryKeptInDeadBlock = lastStatementBoundary && !canMoveStatementBoundaryUnderNextLabel;
    }

    return instr;
}